

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Circle.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  RVOSimulator *this;
  
  this = (RVOSimulator *)operator_new(0x50);
  RVO::RVOSimulator::RVOSimulator(this);
  setupScenario(this);
  do {
    updateVisualization(this);
    setPreferredVelocities(this);
    RVO::RVOSimulator::doStep(this);
    bVar1 = reachedGoal(this);
  } while (!bVar1);
  RVO::RVOSimulator::~RVOSimulator(this);
  operator_delete(this,0x50);
  return 0;
}

Assistant:

int main()
{
	/* Create a new simulator instance. */
	RVO::RVOSimulator *sim = new RVO::RVOSimulator();

	/* Set up the scenario. */
	setupScenario(sim);

	/* Perform (and manipulate) the simulation. */
	do {
#if RVO_OUTPUT_TIME_AND_POSITIONS
		updateVisualization(sim);
#endif
		setPreferredVelocities(sim);
		sim->doStep();
	}
	while (!reachedGoal(sim));

	delete sim;

	return 0;
}